

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkaccessmanager.cpp
# Opt level: O0

QNetworkReply * __thiscall
QNetworkAccessManager::put
          (QNetworkAccessManager *this,QNetworkRequest *request,QHttpMultiPart *multiPart)

{
  QNetworkReply *pQVar1;
  QHttpMultiPart *in_RDX;
  QNetworkRequest *in_RSI;
  QNetworkAccessManagerPrivate *in_RDI;
  long in_FS_OFFSET;
  QNetworkReply *reply;
  QIODevice *device;
  QNetworkRequest newRequest;
  QNetworkRequest *request_00;
  QNetworkAccessManager *in_stack_ffffffffffffffc0;
  QNetworkAccessManagerPrivate *this_00;
  QNetworkRequest local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_10.d.d.ptr =
       (QSharedDataPointer<QNetworkRequestPrivate>)
       (totally_ordered_wrapper<QNetworkRequestPrivate_*>)0xaaaaaaaaaaaaaaaa;
  this_00 = in_RDI;
  d_func((QNetworkAccessManager *)0x19c4f3);
  request_00 = &local_10;
  QNetworkAccessManagerPrivate::prepareMultipart(this_00,in_RSI,in_RDX);
  QHttpMultiPart::d_func((QHttpMultiPart *)0x19c519);
  pQVar1 = put(in_stack_ffffffffffffffc0,request_00,(QIODevice *)in_RDI);
  QNetworkRequest::~QNetworkRequest((QNetworkRequest *)in_RDI);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return pQVar1;
  }
  __stack_chk_fail();
}

Assistant:

QNetworkReply *QNetworkAccessManager::put(const QNetworkRequest &request, QHttpMultiPart *multiPart)
{
    QNetworkRequest newRequest = d_func()->prepareMultipart(request, multiPart);
    QIODevice *device = multiPart->d_func()->device;
    QNetworkReply *reply = put(newRequest, device);
    return reply;
}